

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
BuildWithLogTestRestatSingleDependentOutputDirty::Run
          (BuildWithLogTestRestatSingleDependentOutputDirty *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  size_type sVar6;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  undefined4 local_c8;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string err;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ManifestParserOptions local_1c;
  int local_14;
  BuildWithLogTestRestatSingleDependentOutputDirty *pBStack_10;
  int fail_count;
  BuildWithLogTestRestatSingleDependentOutputDirty *this_local;
  
  pBStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_BuildWithLogTest).super_BuildTest.super_StateTestWithBuiltinRules.state_
              ,
              "rule true\n  command = true\n  restat = 1\nrule touch\n  command = touch\nbuild out1: true in\nbuild out2 out3: touch out1\nbuild out4: touch out2\n"
              ,local_1c);
  iVar2 = local_14;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"in",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"",(allocator<char> *)(err.field_2._M_local_buf + 0xf));
    VirtualFileSystem::Create
              (&(this->super_BuildWithLogTest).super_BuildTest.fs_,&local_40,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::__cxx11::string::string((string *)local_a0);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"out4",&local_c1);
    pNVar5 = Builder::AddTarget(&(this->super_BuildWithLogTest).super_BuildTest.builder_,&local_c0,
                                (string *)local_a0);
    testing::Test::Check
              (pTVar1,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x5da,"builder_.AddTarget(\"out4\", &err)");
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    pTVar1 = g_current_test;
    bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_a0);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x5db,"\"\" == err");
    pTVar1 = g_current_test;
    if (bVar3) {
      bVar3 = Builder::Build(&(this->super_BuildWithLogTest).super_BuildTest.builder_,
                             (string *)local_a0);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x5dc,"builder_.Build(&err)");
      pTVar1 = g_current_test;
      bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_a0);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x5dd,"\"\" == err");
      pTVar1 = g_current_test;
      if (bVar3) {
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&(this->super_BuildWithLogTest).super_BuildTest.command_runner_.commands_ran_
                      );
        bVar3 = testing::Test::Check
                          (pTVar1,sVar6 == 3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x5de,"3u == command_runner_.commands_ran_.size()");
        if (bVar3) {
          VirtualFileSystem::Tick(&(this->super_BuildWithLogTest).super_BuildTest.fs_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"in",&local_e9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_111);
          VirtualFileSystem::Create
                    (&(this->super_BuildWithLogTest).super_BuildTest.fs_,&local_e8,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          std::allocator<char>::~allocator(&local_111);
          std::__cxx11::string::~string((string *)&local_e8);
          std::allocator<char>::~allocator(&local_e9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"out3",&local_139)
          ;
          VirtualFileSystem::RemoveFile
                    (&(this->super_BuildWithLogTest).super_BuildTest.fs_,&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          std::allocator<char>::~allocator(&local_139);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&(this->super_BuildWithLogTest).super_BuildTest.command_runner_.commands_ran_);
          State::Reset(&(this->super_BuildWithLogTest).super_BuildTest.
                        super_StateTestWithBuiltinRules.state_);
          pTVar1 = g_current_test;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"out4",&local_161)
          ;
          pNVar5 = Builder::AddTarget(&(this->super_BuildWithLogTest).super_BuildTest.builder_,
                                      &local_160,(string *)local_a0);
          testing::Test::Check
                    (pTVar1,pNVar5 != (Node *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0x5eb,"builder_.AddTarget(\"out4\", &err)");
          std::__cxx11::string::~string((string *)&local_160);
          std::allocator<char>::~allocator(&local_161);
          pTVar1 = g_current_test;
          bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_a0);
          bVar3 = testing::Test::Check
                            (pTVar1,bVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x5ec,"\"\" == err");
          pTVar1 = g_current_test;
          if (bVar3) {
            bVar3 = Builder::Build(&(this->super_BuildWithLogTest).super_BuildTest.builder_,
                                   (string *)local_a0);
            testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x5ed,"builder_.Build(&err)");
            pTVar1 = g_current_test;
            bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_a0);
            bVar3 = testing::Test::Check
                              (pTVar1,bVar3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                               ,0x5ee,"\"\" == err");
            pTVar1 = g_current_test;
            if (bVar3) {
              sVar6 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(&(this->super_BuildWithLogTest).super_BuildTest.command_runner_.
                              commands_ran_);
              bVar3 = testing::Test::Check
                                (pTVar1,sVar6 == 3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                 ,0x5ef,"3u == command_runner_.commands_ran_.size()");
              if (bVar3) {
                local_c8 = 0;
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                local_c8 = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              local_c8 = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            local_c8 = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          local_c8 = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        local_c8 = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_c8 = 1;
    }
    std::__cxx11::string::~string((string *)local_a0);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(BuildWithLogTest, RestatSingleDependentOutputDirty) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
    "rule true\n"
    "  command = true\n"
    "  restat = 1\n"
    "rule touch\n"
    "  command = touch\n"
    "build out1: true in\n"
    "build out2 out3: touch out1\n"
    "build out4: touch out2\n"
    ));

  // Create the necessary files
  fs_.Create("in", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out4", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(3u, command_runner_.commands_ran_.size());

  fs_.Tick();
  fs_.Create("in", "");
  fs_.RemoveFile("out3");

  // Since "in" is missing, out1 will be built. Since "out3" is missing,
  // out2 and out3 will be built even though "in" is not touched when built.
  // Then, since out2 is rebuilt, out4 should be rebuilt -- the restat on the
  // "true" rule should not lead to the "touch" edge writing out2 and out3 being
  // cleard.
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("out4", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(3u, command_runner_.commands_ran_.size());
}